

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::FboRenderTestGroup::init(FboRenderTestGroup *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  deUint32 dVar3;
  uint uVar4;
  uint extraout_EAX;
  TestNode *pTVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  RecreateBuffersTest *pRVar8;
  int fmtNdx;
  long lVar9;
  long lVar10;
  int colorFmtNdx;
  uint uVar11;
  FboConfig config;
  FboConfig colorDepthStencilConfig;
  FboConfig colorDepthConfig;
  FboConfig local_a8;
  TestNode *local_88;
  TestNode *local_80;
  long local_78;
  FboConfig local_70;
  FboConfig local_50;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "stencil_clear","Stencil buffer clears");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar9 = 0;
  do {
    if (init::depthStencilFormats[lVar9].stencil == true) {
      local_a8.depthStencilFormat = init::depthStencilFormats[lVar9].format;
      local_a8.buffers = 0x4400;
      local_a8.colorType = 0xde1;
      local_a8.colorFormat = 0x8058;
      local_a8.depthStencilType = 0x8d41;
      local_a8.width = 0;
      local_a8.height = 0;
      local_a8.samples = 0;
      pTVar6 = (TestNode *)operator_new(0x98);
      FboCases::StencilClearsTest::StencilClearsTest
                ((StencilClearsTest *)pTVar6,(this->super_TestCaseGroup).m_context,&local_a8);
      tcu::TestNode::addChild(pTVar5,pTVar6);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "shared_colorbuffer_clear","Shader colorbuffer clears");
  local_88 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar9 = 0;
  do {
    if ((init::colorFormats[lVar9].type & ~FORMATTYPE_FIXED) != FORMATTYPE_INT) {
      dVar3 = init::colorFormats[lVar9].format;
      lVar10 = 0;
      do {
        local_a8.colorType = *(GLenum *)((long)init::objectTypes + lVar10);
        local_a8.buffers = 0x4000;
        local_a8.depthStencilType = 0;
        local_a8.depthStencilFormat = 0;
        local_a8.width = 0;
        local_a8.height = 0;
        local_a8.samples = 0;
        local_a8.colorFormat = dVar3;
        pTVar6 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferClearsTest::SharedColorbufferClearsTest
                  ((SharedColorbufferClearsTest *)pTVar6,(Context *)local_88[1]._vptr_TestNode,
                   &local_a8);
        tcu::TestNode::addChild(pTVar5,pTVar6);
        lVar10 = lVar10 + 4;
      } while (lVar10 == 4);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x24);
  pTVar6 = (TestNode *)operator_new(0x70);
  pTVar5 = local_88;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_88->m_testCtx,"shared_colorbuffer",
             "Shared colorbuffer tests");
  local_80 = pTVar6;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = local_80;
  lVar9 = 0;
  do {
    if (((((init::colorFormats[lVar9].type & ~FORMATTYPE_FIXED) != FORMATTYPE_INT) &&
         (dVar3 = init::colorFormats[lVar9].format, 1 < dVar3 - 0x8814)) && (dVar3 != 0x822e)) &&
       (dVar3 != 0x8230)) {
      lVar10 = 0;
      do {
        local_a8.colorType = *(GLenum *)((long)init::objectTypes + lVar10);
        local_a8.buffers = 0x4000;
        local_a8.samples = 0;
        local_a8.depthStencilType = 0;
        local_a8.depthStencilFormat = 0;
        local_a8.width = 0;
        local_a8.height = 0;
        local_50.buffers = 0x4100;
        local_50.depthStencilType = 0x8d41;
        local_50.depthStencilFormat = 0x88f0;
        local_50.width = 0;
        local_50.height = 0;
        local_50.samples = 0;
        local_70.buffers = 0x4500;
        local_70.depthStencilType = 0x8d41;
        local_70.depthStencilFormat = 0x88f0;
        local_70.width = 0;
        local_70.height = 0;
        local_70.samples = 0;
        local_a8.colorFormat = dVar3;
        local_70.colorType = local_a8.colorType;
        local_70.colorFormat = dVar3;
        local_50.colorType = local_a8.colorType;
        local_50.colorFormat = dVar3;
        pTVar7 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar7,(Context *)pTVar5[1]._vptr_TestNode,&local_a8);
        tcu::TestNode::addChild(pTVar6,pTVar7);
        pTVar7 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar7,(Context *)pTVar5[1]._vptr_TestNode,&local_50);
        tcu::TestNode::addChild(pTVar6,pTVar7);
        pTVar7 = (TestNode *)operator_new(0x98);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar7,(Context *)pTVar5[1]._vptr_TestNode,&local_70);
        tcu::TestNode::addChild(pTVar6,pTVar7);
        lVar10 = lVar10 + 4;
      } while (lVar10 == 4);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x24);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar5->m_testCtx,"shared_depth_stencil",
             "Shared depth and stencil buffers");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar9 = 0;
  do {
    if (init::depthStencilFormats[lVar9].depth == true) {
      bVar1 = init::depthStencilFormats[lVar9].stencil;
      dVar3 = init::depthStencilFormats[lVar9].format;
      lVar10 = 0;
      do {
        local_a8.depthStencilType = *(GLenum *)((long)init::objectTypes + lVar10);
        local_a8.colorType = 0xde1;
        local_a8.colorFormat = 0x8058;
        local_a8.width = 0;
        local_a8.height = 0;
        local_a8.samples = 0;
        local_a8.buffers = (uint)bVar1 << 10 | 0x4100;
        local_a8.depthStencilFormat = dVar3;
        pTVar5 = (TestNode *)operator_new(0x98);
        FboCases::SharedDepthStencilTest::SharedDepthStencilTest
                  ((SharedDepthStencilTest *)pTVar5,(Context *)local_88[1]._vptr_TestNode,&local_a8)
        ;
        tcu::TestNode::addChild(pTVar6,pTVar5);
        lVar10 = lVar10 + 4;
      } while (lVar10 == 4);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  pTVar6 = (TestNode *)operator_new(0x70);
  pTVar5 = local_88;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_88->m_testCtx,"resize","FBO resize tests");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar9 = 0;
  do {
    local_80 = (TestNode *)CONCAT44(local_80._4_4_,init::colorFormats[lVar9].format);
    lVar10 = 0;
    do {
      local_a8.colorType = *(GLenum *)((long)init::objectTypes + lVar10);
      local_a8.buffers = 0x4000;
      local_a8.colorFormat = (GLenum)local_80;
      local_a8.depthStencilType = 0;
      local_a8.depthStencilFormat = 0;
      local_a8.width = 0;
      local_a8.height = 0;
      local_a8.samples = 0;
      pTVar7 = (TestNode *)operator_new(0x98);
      FboCases::ResizeTest::ResizeTest
                ((ResizeTest *)pTVar7,(Context *)pTVar5[1]._vptr_TestNode,&local_a8);
      tcu::TestNode::addChild(pTVar6,pTVar7);
      lVar10 = lVar10 + 4;
    } while (lVar10 == 4);
    local_78 = lVar9;
    if (((GLenum)local_80 == 0x881a) || ((GLenum)local_80 == 0x8058)) {
      lVar9 = 0;
      do {
        bVar1 = init::depthStencilFormats[lVar9].depth;
        bVar2 = init::depthStencilFormats[lVar9].stencil;
        lVar10 = 0;
        do {
          uVar11 = 0x4100;
          if ((bVar1 != false) || (uVar11 = 0x4000, lVar10 == 4)) {
            local_a8.buffers = uVar11 | (uint)bVar2 << 10;
            local_a8.depthStencilType = *(GLenum *)((long)init::objectTypes + lVar10);
            local_a8.depthStencilFormat = init::depthStencilFormats[lVar9].format;
            local_a8.colorType = 0xde1;
            local_a8.colorFormat = (GLenum)local_80;
            local_a8.width = 0;
            local_a8.height = 0;
            local_a8.samples = 0;
            pTVar5 = (TestNode *)operator_new(0x98);
            FboCases::ResizeTest::ResizeTest
                      ((ResizeTest *)pTVar5,(Context *)local_88[1]._vptr_TestNode,&local_a8);
            tcu::TestNode::addChild(pTVar6,pTVar5);
          }
          lVar10 = lVar10 + 4;
        } while (lVar10 == 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 6);
    }
    pTVar5 = local_88;
    lVar9 = local_78 + 1;
  } while (lVar9 != 0x24);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar5->m_testCtx,"recreate_color","Recreate colorbuffer tests"
            );
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar9 = 0;
  do {
    dVar3 = init::colorFormats[lVar9].format;
    lVar10 = 0;
    do {
      local_a8.colorType = *(GLenum *)((long)init::objectTypes + lVar10);
      local_a8.buffers = 0x4500;
      local_a8.depthStencilType = 0x8d41;
      local_a8.depthStencilFormat = 0x88f0;
      local_a8.width = 0;
      local_a8.height = 0;
      local_a8.samples = 0;
      local_a8.colorFormat = dVar3;
      pRVar8 = (RecreateBuffersTest *)operator_new(0xa0);
      FboCases::RecreateBuffersTest::RecreateBuffersTest
                (pRVar8,(Context *)local_88[1]._vptr_TestNode,&local_a8,0x4000,true);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pRVar8);
      lVar10 = lVar10 + 4;
    } while (lVar10 == 4);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x24);
  pTVar6 = (TestNode *)operator_new(0x70);
  pTVar5 = local_88;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_88->m_testCtx,"recreate_depth_stencil",
             "Recreate depth and stencil buffers");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar9 = 0;
  do {
    local_80 = (TestNode *)CONCAT71(local_80._1_7_,init::depthStencilFormats[lVar9].depth);
    uVar11 = (uint)init::depthStencilFormats[lVar9].stencil * 0x400;
    lVar10 = 0;
    do {
      uVar4 = 0x100;
      if (((char)local_80 != '\0') || (uVar4 = 0, lVar10 == 4)) {
        local_a8.buffers = uVar4 + uVar11 + 0x4000;
        local_a8.depthStencilType = *(GLenum *)((long)init::objectTypes + lVar10);
        local_a8.depthStencilFormat = init::depthStencilFormats[lVar9].format;
        local_a8.colorType = 0xde1;
        local_a8.colorFormat = 0x8058;
        local_a8.width = 0;
        local_a8.height = 0;
        local_a8.samples = 0;
        pRVar8 = (RecreateBuffersTest *)operator_new(0xa0);
        FboCases::RecreateBuffersTest::RecreateBuffersTest
                  (pRVar8,(Context *)local_88[1]._vptr_TestNode,&local_a8,uVar4 | uVar11,true);
        tcu::TestNode::addChild(pTVar6,(TestNode *)pRVar8);
        uVar4 = extraout_EAX;
      }
      lVar10 = lVar10 + 4;
    } while (lVar10 == 4);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  return uVar4;
}

Assistant:

void FboRenderTestGroup::init (void)
{
	static const deUint32 objectTypes[] =
	{
		GL_TEXTURE_2D,
		GL_RENDERBUFFER
	};

	enum FormatType
	{
		FORMATTYPE_FLOAT = 0,
		FORMATTYPE_FIXED,
		FORMATTYPE_INT,
		FORMATTYPE_UINT,

		FORMATTYPE_LAST
	};

	// Required by specification.
	static const struct
	{
		deUint32	format;
		FormatType	type;
	} colorFormats[] =
	{
		{ GL_RGBA32F,			FORMATTYPE_FLOAT	},
		{ GL_RGBA32I,			FORMATTYPE_INT		},
		{ GL_RGBA32UI,			FORMATTYPE_UINT		},
		{ GL_RGBA16F,			FORMATTYPE_FLOAT	},
		{ GL_RGBA16I,			FORMATTYPE_INT		},
		{ GL_RGBA16UI,			FORMATTYPE_UINT		},
		{ GL_RGB16F,			FORMATTYPE_FLOAT	},
		{ GL_RGBA8,				FORMATTYPE_FIXED	},
		{ GL_RGBA8I,			FORMATTYPE_INT		},
		{ GL_RGBA8UI,			FORMATTYPE_UINT		},
		{ GL_SRGB8_ALPHA8,		FORMATTYPE_FIXED	},
		{ GL_RGB10_A2,			FORMATTYPE_FIXED	},
		{ GL_RGB10_A2UI,		FORMATTYPE_UINT		},
		{ GL_RGBA4,				FORMATTYPE_FIXED	},
		{ GL_RGB5_A1,			FORMATTYPE_FIXED	},
		{ GL_RGB8,				FORMATTYPE_FIXED	},
		{ GL_RGB565,			FORMATTYPE_FIXED	},
		{ GL_R11F_G11F_B10F,	FORMATTYPE_FLOAT	},
		{ GL_RG32F,				FORMATTYPE_FLOAT	},
		{ GL_RG32I,				FORMATTYPE_INT		},
		{ GL_RG32UI,			FORMATTYPE_UINT		},
		{ GL_RG16F,				FORMATTYPE_FLOAT	},
		{ GL_RG16I,				FORMATTYPE_INT		},
		{ GL_RG16UI,			FORMATTYPE_UINT		},
		{ GL_RG8,				FORMATTYPE_FLOAT	},
		{ GL_RG8I,				FORMATTYPE_INT		},
		{ GL_RG8UI,				FORMATTYPE_UINT		},
		{ GL_R32F,				FORMATTYPE_FLOAT	},
		{ GL_R32I,				FORMATTYPE_INT		},
		{ GL_R32UI,				FORMATTYPE_UINT		},
		{ GL_R16F,				FORMATTYPE_FLOAT	},
		{ GL_R16I,				FORMATTYPE_INT		},
		{ GL_R16UI,				FORMATTYPE_UINT		},
		{ GL_R8,				FORMATTYPE_FLOAT	},
		{ GL_R8I,				FORMATTYPE_INT		},
		{ GL_R8UI,				FORMATTYPE_UINT		}
	};

	static const struct
	{
		deUint32	format;
		bool		depth;
		bool		stencil;
	} depthStencilFormats[] =
	{
		{ GL_DEPTH_COMPONENT32F,	true,	false	},
		{ GL_DEPTH_COMPONENT24,		true,	false	},
		{ GL_DEPTH_COMPONENT16,		true,	false	},
		{ GL_DEPTH32F_STENCIL8,		true,	true	},
		{ GL_DEPTH24_STENCIL8,		true,	true	},
		{ GL_STENCIL_INDEX8,		false,	true	}
	};

	using namespace FboCases;

	// .stencil_clear
	tcu::TestCaseGroup* stencilClearGroup = new tcu::TestCaseGroup(m_testCtx, "stencil_clear", "Stencil buffer clears");
	addChild(stencilClearGroup);
	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
	{
		deUint32	colorType	= GL_TEXTURE_2D;
		deUint32	stencilType	= GL_RENDERBUFFER;
		deUint32	colorFmt	= GL_RGBA8;

		if (!depthStencilFormats[fmtNdx].stencil)
			continue;

		FboConfig config(GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT, colorType, colorFmt, stencilType, depthStencilFormats[fmtNdx].format);
		stencilClearGroup->addChild(new StencilClearsTest(m_context, config));
	}

	// .shared_colorbuffer_clear
	tcu::TestCaseGroup* sharedColorbufferClearGroup = new tcu::TestCaseGroup(m_testCtx, "shared_colorbuffer_clear", "Shader colorbuffer clears");
	addChild(sharedColorbufferClearGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		// Clearing of integer buffers is undefined.
		if (colorFormats[colorFmtNdx].type == FORMATTYPE_INT || colorFormats[colorFmtNdx].type == FORMATTYPE_UINT)
			continue;

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT, objectTypes[typeNdx], colorFormats[colorFmtNdx].format, GL_NONE, GL_NONE);
			sharedColorbufferClearGroup->addChild(new SharedColorbufferClearsTest(m_context, config));
		}
	}

	// .shared_colorbuffer
	tcu::TestCaseGroup* sharedColorbufferGroup = new tcu::TestCaseGroup(m_testCtx, "shared_colorbuffer", "Shared colorbuffer tests");
	addChild(sharedColorbufferGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		deUint32	depthStencilType	= GL_RENDERBUFFER;
		deUint32	depthStencilFormat	= GL_DEPTH24_STENCIL8;

		// Blending with integer buffers and fp32 targets is not supported.
		if (colorFormats[colorFmtNdx].type == FORMATTYPE_INT	||
			colorFormats[colorFmtNdx].type == FORMATTYPE_UINT	||
			colorFormats[colorFmtNdx].format == GL_RGBA32F		||
			colorFormats[colorFmtNdx].format == GL_RGB32F		||
			colorFormats[colorFmtNdx].format == GL_RG32F		||
			colorFormats[colorFmtNdx].format == GL_R32F)
			continue;

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig colorOnlyConfig			(GL_COLOR_BUFFER_BIT,											objectTypes[typeNdx], colorFormats[colorFmtNdx].format, GL_NONE, GL_NONE);
			FboConfig colorDepthConfig			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT,						objectTypes[typeNdx], colorFormats[colorFmtNdx].format, depthStencilType, depthStencilFormat);
			FboConfig colorDepthStencilConfig	(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT,	objectTypes[typeNdx], colorFormats[colorFmtNdx].format, depthStencilType, depthStencilFormat);

			sharedColorbufferGroup->addChild(new SharedColorbufferTest(m_context, colorOnlyConfig));
			sharedColorbufferGroup->addChild(new SharedColorbufferTest(m_context, colorDepthConfig));
			sharedColorbufferGroup->addChild(new SharedColorbufferTest(m_context, colorDepthStencilConfig));
		}
	}

	// .shared_depth_stencil
	tcu::TestCaseGroup* sharedDepthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "shared_depth_stencil", "Shared depth and stencil buffers");
	addChild(sharedDepthStencilGroup);
	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
	{
		deUint32	colorType		= GL_TEXTURE_2D;
		deUint32	colorFmt		= GL_RGBA8;
		bool		depth			= depthStencilFormats[fmtNdx].depth;
		bool		stencil			= depthStencilFormats[fmtNdx].stencil;

		if (!depth)
			continue; // Not verified.

		// Depth and stencil: both rbo and textures
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT|(depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0), colorType, colorFmt, objectTypes[typeNdx], depthStencilFormats[fmtNdx].format);
			sharedDepthStencilGroup->addChild(new SharedDepthStencilTest(m_context, config));
		}
	}

	// .resize
	tcu::TestCaseGroup* resizeGroup = new tcu::TestCaseGroup(m_testCtx, "resize", "FBO resize tests");
	addChild(resizeGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		deUint32 colorFormat = colorFormats[colorFmtNdx].format;

		// Color-only.
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT, objectTypes[typeNdx], colorFormat, GL_NONE, GL_NONE);
			resizeGroup->addChild(new ResizeTest(m_context, config));
		}

		// For selected color formats tests depth & stencil variants.
		if (colorFormat == GL_RGBA8 || colorFormat == GL_RGBA16F)
		{
			for (int depthStencilFmtNdx = 0; depthStencilFmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); depthStencilFmtNdx++)
			{
				deUint32	colorType		= GL_TEXTURE_2D;
				bool		depth			= depthStencilFormats[depthStencilFmtNdx].depth;
				bool		stencil			= depthStencilFormats[depthStencilFmtNdx].stencil;

				// Depth and stencil: both rbo and textures
				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
				{
					if (!depth && objectTypes[typeNdx] != GL_RENDERBUFFER)
						continue; // Not supported.

					FboConfig config(GL_COLOR_BUFFER_BIT|(depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0),
									 colorType, colorFormat,
									 objectTypes[typeNdx], depthStencilFormats[depthStencilFmtNdx].format);
					resizeGroup->addChild(new ResizeTest(m_context, config));
				}
			}
		}
	}

	// .recreate_color
	tcu::TestCaseGroup* recreateColorGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_color", "Recreate colorbuffer tests");
	addChild(recreateColorGroup);
	for (int colorFmtNdx = 0; colorFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); colorFmtNdx++)
	{
		deUint32	colorFormat			= colorFormats[colorFmtNdx].format;
		deUint32	depthStencilFormat	= GL_DEPTH24_STENCIL8;
		deUint32	depthStencilType	= GL_RENDERBUFFER;

		// Color-only.
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			FboConfig config(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT, objectTypes[typeNdx], colorFormat, depthStencilType, depthStencilFormat);
			recreateColorGroup->addChild(new RecreateBuffersTest(m_context, config, GL_COLOR_BUFFER_BIT, true /* rebind */));
		}
	}

	// .recreate_depth_stencil
	tcu::TestCaseGroup* recreateDepthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_depth_stencil", "Recreate depth and stencil buffers");
	addChild(recreateDepthStencilGroup);
	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
	{
		deUint32	colorType		= GL_TEXTURE_2D;
		deUint32	colorFmt		= GL_RGBA8;
		bool		depth			= depthStencilFormats[fmtNdx].depth;
		bool		stencil			= depthStencilFormats[fmtNdx].stencil;

		// Depth and stencil: both rbo and textures
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(objectTypes); typeNdx++)
		{
			if (!depth && objectTypes[typeNdx] != GL_RENDERBUFFER)
				continue;

			FboConfig config(GL_COLOR_BUFFER_BIT|(depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0), colorType, colorFmt, objectTypes[typeNdx], depthStencilFormats[fmtNdx].format);
			recreateDepthStencilGroup->addChild(new RecreateBuffersTest(m_context, config, (depth ? GL_DEPTH_BUFFER_BIT : 0)|(stencil ? GL_STENCIL_BUFFER_BIT : 0), true /* rebind */));
		}
	}
}